

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tjunittest.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  void *__ptr;
  long lVar2;
  int *piVar3;
  int align;
  uint width;
  ulong uVar4;
  long lVar5;
  int align_00;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  char *__format;
  undefined8 in_R8;
  undefined8 in_R9;
  char **ppcVar9;
  long lVar10;
  ulong uVar11;
  size_t __size;
  uchar *dstBuf;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  long local_48;
  long local_40;
  ulong local_38;
  
  if (1 < argc) {
    for (uVar4 = 1; (uint)argc != uVar4; uVar4 = uVar4 + 1) {
      pcVar8 = argv[uVar4];
      iVar1 = strcasecmp(pcVar8,"-yuv");
      piVar3 = &doYUV;
      if (iVar1 != 0) {
        iVar1 = strcasecmp(pcVar8,"-noyuvpad");
        piVar3 = &pad;
        if (iVar1 != 0) {
          iVar1 = strcasecmp(pcVar8,"-alloc");
          piVar3 = &alloc;
          if (iVar1 != 0) {
            iVar1 = strcasecmp(pcVar8,"-bmp");
            if (iVar1 != 0) {
              printf("\nUSAGE: %s [options]\n\n",*argv);
              puts("Options:");
              puts("-yuv = test YUV encoding/decoding support");
              puts("-noyuvpad = do not pad each line of each Y, U, and V plane to the nearest");
              puts("            4-byte boundary");
              puts("-alloc = test automatic buffer allocation");
              puts("-bmp = tjLoadImage()/tjSaveImage() unit test\n");
              exit(1);
            }
            width = 1;
            do {
              ppcVar9 = pixFormatStr;
              if (8 < width) {
                return 0;
              }
              for (lVar6 = 0; lVar6 != 0xc; lVar6 = lVar6 + 1) {
                printf("%s Top-Down BMP (row alignment = %d bytes)  ...  ",*ppcVar9,(ulong)width);
                align_00 = (int)lVar6;
                iVar1 = doBmpTest("bmp",width,align_00,0,(int)in_R8,(int)in_R9);
                if (iVar1 == -1) {
                  return -1;
                }
                puts("OK.");
                printf("%s Top-Down PPM (row alignment = %d bytes)  ...  ",*ppcVar9,(ulong)width);
                iVar1 = doBmpTest("ppm",width,align_00,2,(int)in_R8,(int)in_R9);
                if (iVar1 == -1) {
                  return -1;
                }
                puts("OK.");
                printf("%s Bottom-Up BMP (row alignment = %d bytes)  ...  ",*ppcVar9,(ulong)width);
                iVar1 = doBmpTest("bmp",width,align_00,0,(int)in_R8,(int)in_R9);
                if (iVar1 == -1) {
                  return -1;
                }
                puts("OK.");
                printf("%s Bottom-Up PPM (row alignment = %d bytes)  ...  ",*ppcVar9,(ulong)width);
                iVar1 = doBmpTest("ppm",width,align_00,2,(int)in_R8,(int)in_R9);
                if (iVar1 == -1) {
                  return -1;
                }
                puts("OK.");
                ppcVar9 = ppcVar9 + 1;
              }
              width = width * 2;
            } while( true );
          }
        }
      }
      *piVar3 = 1;
    }
  }
  if (alloc != 0) {
    puts("Testing automatic buffer allocation");
  }
  iVar1 = (doYUV == 0) + 4;
  uVar4 = tjBufSize(0x6883,0x6883,0);
  if (uVar4 < 0xffffffff) {
    pcVar8 = "tjBufSize() overflow";
  }
  else {
    uVar4 = TJBUFSIZE(0x6883,0x6883);
    if (uVar4 < 0xffffffff) {
      pcVar8 = "TJBUFSIZE() overflow";
    }
    else {
      uVar4 = tjBufSizeYUV2(0x93ce,1,0x93ce,0);
      if (uVar4 < 0xffffffff) {
        pcVar8 = "tjBufSizeYUV2() overflow";
      }
      else {
        uVar4 = TJBUFSIZEYUV(0x93ce,0x93ce,0);
        if (uVar4 < 0xffffffff) {
          pcVar8 = "TJBUFSIZEYUV() overflow";
        }
        else {
          uVar4 = tjBufSizeYUV(0x93ce,0x93ce,0);
          if (uVar4 < 0xffffffff) {
            pcVar8 = "tjBufSizeYUV() overflow";
          }
          else {
            uVar4 = tjPlaneSizeYUV(0,0x10000,0,0x10000);
            if (0xfffffffe < uVar4) goto LAB_001026ea;
            pcVar8 = "tjPlaneSizeYUV() overflow";
          }
        }
      }
    }
  }
  printf("ERROR: %s\n",pcVar8);
  exitStatus = -1;
LAB_001026ea:
  doTest(0x23,0x27,_3byteFormats,2,0,"test");
  doTest(0x27,0x29,_4byteFormats,iVar1,0,"test");
  doTest(0x29,0x23,_3byteFormats,2,1,"test");
  doTest(0x23,0x27,_4byteFormats,iVar1,1,"test");
  doTest(0x27,0x29,_3byteFormats,2,2,"test");
  doTest(0x29,0x23,_4byteFormats,iVar1,2,"test");
  doTest(0x23,0x27,_3byteFormats,2,4,"test");
  doTest(0x27,0x29,_4byteFormats,iVar1,4,"test");
  doTest(0x29,0x23,_3byteFormats,2,5,"test");
  doTest(0x23,0x27,_4byteFormats,iVar1,5,"test");
  doTest(0x27,0x29,_onlyGray,1,3,"test");
  doTest(0x29,0x23,_3byteFormats,2,3,"test");
  doTest(0x23,0x27,_4byteFormats,4,3,"test");
  dstBuf = (uchar *)0x0;
  local_50 = 0;
  lVar6 = tjInitCompress();
  if (lVar6 == 0) {
    pcVar8 = (char *)tjGetErrorStr();
    __ptr = (void *)0x0;
LAB_00102c35:
    __format = "TurboJPEG ERROR:\n%s\n";
LAB_00102c38:
    printf(__format,pcVar8);
    exitStatus = -1;
  }
  else {
    puts("Buffer size regression test");
    local_58 = 0;
    while( true ) {
      uVar4 = 1;
      lVar5 = 4;
      if ((int)local_58 == 6) break;
      while( true ) {
        local_48 = lVar5;
        uVar11 = 1;
        if (uVar4 == 0x30) break;
        local_40 = uVar4 * 4;
        lVar5 = local_48;
        uVar7 = local_58;
        local_60 = uVar4;
        local_38 = 0x30;
        if (uVar4 == 1) {
          local_38 = 0x800;
        }
        while (uVar11 < local_38) {
          if ((int)((uVar11 & 0xffffffff) % 100) == 0) {
            printf("%.4d x %.4d\b\b\b\b\b\b\b\b\b\b\b",uVar4 & 0xffffffff,uVar11 & 0xffffffff);
          }
          __size = uVar11 * local_40;
          local_68 = uVar11;
          __ptr = malloc(__size);
          if (__ptr == (void *)0x0) {
LAB_00102c16:
            __format = "ERROR: %s\n";
            pcVar8 = "Memory allocation failure";
            __ptr = (void *)0x0;
            goto LAB_00102c38;
          }
          if (doYUV != 0 || alloc == 0) {
            if (doYUV == 0) {
              local_50 = tjBufSize(local_60,local_68,uVar7 & 0xffffffff);
            }
            else {
              local_50 = tjBufSizeYUV2(local_60,pad,local_68,uVar7 & 0xffffffff);
            }
            dstBuf = (uchar *)tjAlloc(local_50 & 0xffffffff);
            if (dstBuf != (uchar *)0x0) goto LAB_0010299a;
LAB_00102d51:
            __format = "ERROR: %s\n";
            pcVar8 = "Memory allocation failure";
            goto LAB_00102c38;
          }
LAB_0010299a:
          for (lVar10 = 0; uVar7 = local_58, lVar5 != lVar10; lVar10 = lVar10 + 1) {
            lVar2 = random();
            *(char *)((long)__ptr + lVar10) = -(0x3ffffffe < lVar2);
          }
          if (doYUV == 0) {
            iVar1 = tjCompress2(lVar6,__ptr,local_60,0,local_68,3,&dstBuf,&local_50,local_58,100,
                                (ulong)(alloc == 0) << 10);
          }
          else {
            iVar1 = tjEncodeYUV3(lVar6,__ptr,local_60,0,local_68,3,dstBuf,pad,local_58,0);
          }
          if (iVar1 == -1) {
LAB_00102c29:
            pcVar8 = (char *)tjGetErrorStr();
            goto LAB_00102c35;
          }
          free(__ptr);
          if ((alloc == 0) || (doYUV != 0)) {
            tjFree(dstBuf);
            dstBuf = (uchar *)0x0;
          }
          __ptr = malloc(__size);
          if (__ptr == (void *)0x0) goto LAB_00102c16;
          if (doYUV != 0 || alloc == 0) {
            if (doYUV == 0) {
              local_50 = tjBufSize(local_68,local_60,uVar7 & 0xffffffff);
            }
            else {
              local_50 = tjBufSizeYUV2(local_68,pad,local_60,uVar7 & 0xffffffff);
            }
            dstBuf = (uchar *)tjAlloc(local_50);
            if (dstBuf == (uchar *)0x0) goto LAB_00102d51;
          }
          for (lVar10 = 0; uVar4 = local_60, lVar5 != lVar10; lVar10 = lVar10 + 1) {
            lVar2 = random();
            *(char *)((long)__ptr + lVar10) = -(0x3ffffffe < lVar2);
          }
          if (doYUV == 0) {
            iVar1 = tjCompress2(lVar6,__ptr,local_68,0,local_60 & 0xffffffff,3,&dstBuf,&local_50,
                                uVar7,100,(ulong)(alloc == 0) << 10);
          }
          else {
            iVar1 = tjEncodeYUV3(lVar6,__ptr,local_68,0,local_60 & 0xffffffff,3,dstBuf,pad,uVar7,0);
          }
          if (iVar1 == -1) goto LAB_00102c29;
          free(__ptr);
          if ((alloc == 0) || (doYUV != 0)) {
            tjFree(dstBuf);
            dstBuf = (uchar *)0x0;
          }
          lVar5 = lVar5 + local_48;
          uVar11 = local_68 + 1;
        }
        uVar4 = uVar4 + 1;
        lVar5 = local_48 + 4;
      }
      local_58 = (ulong)((int)local_58 + 1);
    }
    puts("Done.      ");
    __ptr = (void *)0x0;
  }
  free(__ptr);
  tjFree(dstBuf);
  if (lVar6 != 0) {
    tjDestroy(lVar6);
  }
  if (doYUV != 0) {
    puts("\n--------------------\n");
    doTest(0x30,0x30,_onlyRGB,1,0,"test_yuv0");
    doTest(0x30,0x30,_onlyRGB,1,1,"test_yuv0");
    doTest(0x30,0x30,_onlyRGB,1,2,"test_yuv0");
    doTest(0x30,0x30,_onlyRGB,1,4,"test_yuv0");
    doTest(0x30,0x30,_onlyRGB,1,5,"test_yuv0");
    doTest(0x30,0x30,_onlyRGB,1,3,"test_yuv0");
    doTest(0x30,0x30,_onlyGray,1,3,"test_yuv0");
  }
  return exitStatus;
}

Assistant:

int main(int argc, char *argv[])
{
  int i, num4bf = 5;

#ifdef _WIN32
  srand((unsigned int)time(NULL));
#endif
  if (argc > 1) {
    for (i = 1; i < argc; i++) {
      if (!strcasecmp(argv[i], "-yuv")) doYUV = 1;
      else if (!strcasecmp(argv[i], "-noyuvpad")) pad = 1;
      else if (!strcasecmp(argv[i], "-alloc")) alloc = 1;
      else if (!strcasecmp(argv[i], "-bmp")) return bmpTest();
      else usage(argv[0]);
    }
  }
  if (alloc) printf("Testing automatic buffer allocation\n");
  if (doYUV) num4bf = 4;
  overflowTest();
  doTest(35, 39, _3byteFormats, 2, TJSAMP_444, "test");
  doTest(39, 41, _4byteFormats, num4bf, TJSAMP_444, "test");
  doTest(41, 35, _3byteFormats, 2, TJSAMP_422, "test");
  doTest(35, 39, _4byteFormats, num4bf, TJSAMP_422, "test");
  doTest(39, 41, _3byteFormats, 2, TJSAMP_420, "test");
  doTest(41, 35, _4byteFormats, num4bf, TJSAMP_420, "test");
  doTest(35, 39, _3byteFormats, 2, TJSAMP_440, "test");
  doTest(39, 41, _4byteFormats, num4bf, TJSAMP_440, "test");
  doTest(41, 35, _3byteFormats, 2, TJSAMP_411, "test");
  doTest(35, 39, _4byteFormats, num4bf, TJSAMP_411, "test");
  doTest(39, 41, _onlyGray, 1, TJSAMP_GRAY, "test");
  doTest(41, 35, _3byteFormats, 2, TJSAMP_GRAY, "test");
  doTest(35, 39, _4byteFormats, 4, TJSAMP_GRAY, "test");
  bufSizeTest();
  if (doYUV) {
    printf("\n--------------------\n\n");
    doTest(48, 48, _onlyRGB, 1, TJSAMP_444, "test_yuv0");
    doTest(48, 48, _onlyRGB, 1, TJSAMP_422, "test_yuv0");
    doTest(48, 48, _onlyRGB, 1, TJSAMP_420, "test_yuv0");
    doTest(48, 48, _onlyRGB, 1, TJSAMP_440, "test_yuv0");
    doTest(48, 48, _onlyRGB, 1, TJSAMP_411, "test_yuv0");
    doTest(48, 48, _onlyRGB, 1, TJSAMP_GRAY, "test_yuv0");
    doTest(48, 48, _onlyGray, 1, TJSAMP_GRAY, "test_yuv0");
  }

  return exitStatus;
}